

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int allocateBtreePage(BtShared *pBt,MemPage **ppPage,Pgno *pPgno,Pgno nearby,u8 eMode)

{
  u8 uVar1;
  MemPage *pMVar2;
  Bitvec *p;
  bool bVar3;
  MemPage *pPage;
  u32 uVar4;
  Pgno PVar5;
  int iVar6;
  u32 uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  undefined4 extraout_var;
  uint uVar12;
  uint uVar13;
  BtShared *pBt_00;
  u8 *puVar14;
  MemPage *pPage_00;
  ulong uVar15;
  MemPage *pPage_01;
  ulong uVar16;
  bool bVar17;
  uint local_64;
  u8 eType;
  MemPage *pTrunk;
  MemPage **local_48;
  BtShared *local_40;
  undefined8 local_38;
  undefined8 uVar11;
  
  pTrunk = (MemPage *)0x0;
  pMVar2 = pBt->pPage1;
  uVar12 = pBt->nPage;
  uVar4 = sqlite3Get4byte(pMVar2->aData + 0x24);
  uVar11 = CONCAT44(extraout_var,uVar4);
  if (uVar12 <= uVar4) {
    iVar6 = sqlite3CorruptError(0xfedc);
    return iVar6;
  }
  if (uVar4 == 0) {
    uVar1 = pBt->bDoTruncate;
    iVar6 = sqlite3PagerWrite(pMVar2->pDbPage);
    if (iVar6 != 0) {
      return iVar6;
    }
    uVar13 = pBt->nPage;
    uVar12 = uVar13 + 1;
    pBt->nPage = uVar12;
    if (uVar13 == (uint)sqlite3PendingByte / pBt->pageSize) {
      uVar12 = uVar13 + 2;
      pBt->nPage = uVar12;
    }
    uVar13 = (uint)(uVar1 == '\0');
    if ((pBt->autoVacuum != '\0') && (PVar5 = ptrmapPageno(pBt,uVar12), PVar5 == uVar12)) {
      _eType = (MemPage *)0x0;
      iVar6 = btreeGetUnusedPage(pBt,uVar12,(MemPage **)&eType,uVar13);
      pMVar2 = _eType;
      if (iVar6 != 0) {
        return iVar6;
      }
      iVar6 = sqlite3PagerWrite(_eType->pDbPage);
      releasePage(pMVar2);
      if (iVar6 != 0) {
        return iVar6;
      }
      uVar9 = pBt->nPage;
      uVar12 = uVar9 + 1;
      pBt->nPage = uVar12;
      if (uVar9 == (uint)sqlite3PendingByte / pBt->pageSize) {
        uVar12 = uVar9 + 2;
        pBt->nPage = uVar12;
      }
    }
    *(uint *)(pBt->pPage1->aData + 0x1c) =
         uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
    PVar5 = pBt->nPage;
    *pPgno = PVar5;
    iVar6 = btreeGetUnusedPage(pBt,PVar5,ppPage,uVar13);
    if (iVar6 == 0) {
      iVar6 = sqlite3PagerWrite((*ppPage)->pDbPage);
      if (iVar6 == 0) {
        pPage_01 = (MemPage *)0x0;
        pPage_00 = (MemPage *)0x0;
        iVar6 = 0;
      }
      else {
        releasePage(*ppPage);
        *ppPage = (MemPage *)0x0;
        pPage_01 = (MemPage *)0x0;
LAB_0012c330:
        pPage_00 = (MemPage *)0x0;
      }
LAB_0012c38c:
      releasePage(pPage_01);
      releasePage(pPage_00);
    }
    return iVar6;
  }
  local_38 = uVar11;
  if (eMode == '\x02') {
    bVar17 = true;
  }
  else if ((eMode == '\x01') && (nearby <= uVar12)) {
    iVar6 = ptrmapGet(pBt,nearby,&eType,(Pgno *)0x0);
    bVar17 = eType == '\x02';
    if (iVar6 != 0) {
      return iVar6;
    }
  }
  else {
    bVar17 = false;
  }
  iVar6 = sqlite3PagerWrite(pMVar2->pDbPage);
  if (iVar6 != 0) {
    return iVar6;
  }
  uVar13 = (int)local_38 - 1;
  *(uint *)(pMVar2->aData + 0x24) =
       uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 * 0x1000000;
  local_64 = 0;
  pPage_00 = (MemPage *)0x0;
  local_40 = pBt;
LAB_0012be2a:
  pBt_00 = local_40;
  if (pPage_00 == (MemPage *)0x0) {
    puVar14 = pMVar2->aData + 0x20;
  }
  else {
    puVar14 = pPage_00->aData;
  }
  uVar4 = sqlite3Get4byte(puVar14);
  if ((uVar12 < uVar4) || ((uint)local_38 < local_64)) {
    iVar6 = sqlite3CorruptError(0xff14);
LAB_0012c33f:
    pPage_01 = (MemPage *)0x0;
    goto LAB_0012c38c;
  }
  iVar6 = btreeGetUnusedPage(pBt_00,uVar4,&pTrunk,0);
  pPage_01 = pTrunk;
  if (iVar6 != 0) goto LAB_0012c33f;
  puVar14 = pTrunk->aData;
  uVar7 = sqlite3Get4byte(puVar14 + 4);
  if ((bVar17) || (uVar7 != 0)) {
    if ((pBt_00->usableSize >> 2) - 2 < uVar7) {
      iVar6 = sqlite3CorruptError(0xff31);
      goto LAB_0012c38c;
    }
    if (bVar17) {
      if ((uVar4 == nearby) || (eMode == '\x02' && uVar4 < nearby)) {
        *pPgno = uVar4;
        *ppPage = pPage_01;
        iVar6 = sqlite3PagerWrite(pPage_01->pDbPage);
        if (iVar6 != 0) goto LAB_0012c38c;
        if (uVar7 == 0) {
          if (pPage_00 == (MemPage *)0x0) {
            *(undefined4 *)(pMVar2->aData + 0x20) = *(undefined4 *)pPage_01->aData;
          }
          else {
            iVar6 = sqlite3PagerWrite(pPage_00->pDbPage);
            if (iVar6 != 0) goto LAB_0012c38c;
            *(undefined4 *)pPage_00->aData = *(undefined4 *)pPage_01->aData;
          }
        }
        else {
          uVar4 = sqlite3Get4byte(pPage_01->aData + 8);
          if (uVar12 < uVar4) {
            iVar6 = sqlite3CorruptError(0xff53);
            goto LAB_0012c38c;
          }
          iVar6 = btreeGetUnusedPage(pBt_00,uVar4,(MemPage **)&eType,0);
          pPage = _eType;
          if (iVar6 != 0) goto LAB_0012c38c;
          iVar6 = sqlite3PagerWrite(_eType->pDbPage);
          if (iVar6 != 0) {
            releasePage(pPage);
            goto LAB_0012c38c;
          }
          *(undefined4 *)pPage->aData = *(undefined4 *)pPage_01->aData;
          uVar13 = uVar7 - 1;
          *(uint *)(pPage->aData + 4) =
               uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
               uVar13 * 0x1000000;
          memcpy(pPage->aData + 8,pPage_01->aData + 0xc,(ulong)(uVar7 * 4 - 4));
          releasePage(pPage);
          uVar13 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
          if (pPage_00 == (MemPage *)0x0) {
            *(uint *)(pMVar2->aData + 0x20) = uVar13;
            goto LAB_0012bed5;
          }
          iVar6 = sqlite3PagerWrite(pPage_00->pDbPage);
          if (iVar6 != 0) goto LAB_0012c38c;
          *(uint *)pPage_00->aData = uVar13;
        }
        goto LAB_0012bed5;
      }
    }
    if (uVar7 == 0) {
      iVar6 = 0;
    }
    else {
      uVar13 = 0;
      if (nearby != 0) {
        local_48 = ppPage;
        if (eMode == '\x02') {
          uVar9 = 8;
          for (uVar16 = 0; ppPage = local_48, uVar13 = 0, uVar7 != uVar16; uVar16 = uVar16 + 1) {
            uVar4 = sqlite3Get4byte(puVar14 + uVar9);
            if (uVar4 <= nearby) {
              uVar13 = (uint)uVar16;
              ppPage = local_48;
              break;
            }
            uVar9 = uVar9 + 4;
          }
        }
        else {
          uVar4 = sqlite3Get4byte(puVar14 + 8);
          iVar10 = uVar4 - nearby;
          iVar6 = -iVar10;
          if (-1 < iVar10) {
            iVar6 = iVar10;
          }
          uVar15 = 0;
          uVar9 = 0xc;
          for (uVar16 = 1; pBt_00 = local_40, ppPage = local_48, uVar13 = (uint)uVar15,
              uVar7 != uVar16; uVar16 = uVar16 + 1) {
            uVar4 = sqlite3Get4byte(puVar14 + uVar9);
            iVar8 = uVar4 - nearby;
            iVar10 = -iVar8;
            if (-1 < iVar8) {
              iVar10 = iVar8;
            }
            if (iVar10 < iVar6) {
              uVar15 = uVar16 & 0xffffffff;
              iVar6 = iVar10;
            }
            uVar9 = uVar9 + 4;
          }
        }
      }
      uVar4 = sqlite3Get4byte(puVar14 + (uVar13 * 4 + 8));
      if (uVar12 < uVar4) {
        iVar6 = sqlite3CorruptError(0xff94);
        goto LAB_0012c38c;
      }
      if (((uVar4 == nearby) || (eMode == '\x02' && uVar4 < nearby)) || (!bVar17)) {
        *pPgno = uVar4;
        iVar6 = sqlite3PagerWrite(pPage_01->pDbPage);
        if (iVar6 != 0) goto LAB_0012c38c;
        uVar9 = uVar7 - 1;
        if (uVar13 < uVar9) {
          *(undefined4 *)(puVar14 + (uVar13 * 4 + 8)) = *(undefined4 *)(puVar14 + (uVar7 * 4 + 4));
        }
        *(uint *)(puVar14 + 4) =
             uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 * 0x1000000;
        uVar13 = *pPgno;
        p = pBt_00->pHasContent;
        uVar9 = 1;
        if ((p != (Bitvec *)0x0) && (uVar9 = 0, uVar13 <= p->iSize)) {
          uVar9 = sqlite3BitvecTest(p,uVar13);
          uVar9 = uVar9 ^ 1;
        }
        iVar6 = btreeGetUnusedPage(pBt_00,uVar13,ppPage,uVar9);
        if ((iVar6 == 0) && (iVar10 = sqlite3PagerWrite((*ppPage)->pDbPage), iVar6 = 0, iVar10 != 0)
           ) {
          releasePage(*ppPage);
          *ppPage = (MemPage *)0x0;
          iVar6 = iVar10;
        }
        bVar17 = false;
      }
      else {
        iVar6 = 0;
        bVar17 = true;
      }
    }
  }
  else {
    iVar6 = sqlite3PagerWrite(pPage_01->pDbPage);
    if (iVar6 != 0) goto LAB_0012c38c;
    *pPgno = uVar4;
    *(undefined4 *)(pMVar2->aData + 0x20) = *(undefined4 *)pPage_01->aData;
    *ppPage = pPage_01;
LAB_0012bed5:
    pTrunk = (MemPage *)0x0;
    pPage_01 = (MemPage *)0x0;
    bVar17 = false;
    iVar6 = 0;
  }
  local_64 = local_64 + 1;
  releasePage(pPage_00);
  bVar3 = !bVar17;
  bVar17 = true;
  pPage_00 = pPage_01;
  if (bVar3) goto LAB_0012c330;
  goto LAB_0012be2a;
}

Assistant:

static int allocateBtreePage(
  BtShared *pBt,         /* The btree */
  MemPage **ppPage,      /* Store pointer to the allocated page here */
  Pgno *pPgno,           /* Store the page number here */
  Pgno nearby,           /* Search for a page near this one */
  u8 eMode               /* BTALLOC_EXACT, BTALLOC_LT, or BTALLOC_ANY */
){
  MemPage *pPage1;
  int rc;
  u32 n;     /* Number of pages on the freelist */
  u32 k;     /* Number of leaves on the trunk of the freelist */
  MemPage *pTrunk = 0;
  MemPage *pPrevTrunk = 0;
  Pgno mxPage;     /* Total size of the database file */

  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( eMode==BTALLOC_ANY || (nearby>0 && IfNotOmitAV(pBt->autoVacuum)) );
  pPage1 = pBt->pPage1;
  mxPage = btreePagecount(pBt);
  /* EVIDENCE-OF: R-05119-02637 The 4-byte big-endian integer at offset 36
  ** stores stores the total number of pages on the freelist. */
  n = get4byte(&pPage1->aData[36]);
  testcase( n==mxPage-1 );
  if( n>=mxPage ){
    return SQLITE_CORRUPT_BKPT;
  }
  if( n>0 ){
    /* There are pages on the freelist.  Reuse one of those pages. */
    Pgno iTrunk;
    u8 searchList = 0; /* If the free-list must be searched for 'nearby' */
    u32 nSearch = 0;   /* Count of the number of search attempts */
    
    /* If eMode==BTALLOC_EXACT and a query of the pointer-map
    ** shows that the page 'nearby' is somewhere on the free-list, then
    ** the entire-list will be searched for that page.
    */
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( eMode==BTALLOC_EXACT ){
      if( nearby<=mxPage ){
        u8 eType;
        assert( nearby>0 );
        assert( pBt->autoVacuum );
        rc = ptrmapGet(pBt, nearby, &eType, 0);
        if( rc ) return rc;
        if( eType==PTRMAP_FREEPAGE ){
          searchList = 1;
        }
      }
    }else if( eMode==BTALLOC_LE ){
      searchList = 1;
    }
#endif

    /* Decrement the free-list count by 1. Set iTrunk to the index of the
    ** first free-list trunk page. iPrevTrunk is initially 1.
    */
    rc = sqlite3PagerWrite(pPage1->pDbPage);
    if( rc ) return rc;
    put4byte(&pPage1->aData[36], n-1);

    /* The code within this loop is run only once if the 'searchList' variable
    ** is not true. Otherwise, it runs once for each trunk-page on the
    ** free-list until the page 'nearby' is located (eMode==BTALLOC_EXACT)
    ** or until a page less than 'nearby' is located (eMode==BTALLOC_LT)
    */
    do {
      pPrevTrunk = pTrunk;
      if( pPrevTrunk ){
        /* EVIDENCE-OF: R-01506-11053 The first integer on a freelist trunk page
        ** is the page number of the next freelist trunk page in the list or
        ** zero if this is the last freelist trunk page. */
        iTrunk = get4byte(&pPrevTrunk->aData[0]);
      }else{
        /* EVIDENCE-OF: R-59841-13798 The 4-byte big-endian integer at offset 32
        ** stores the page number of the first page of the freelist, or zero if
        ** the freelist is empty. */
        iTrunk = get4byte(&pPage1->aData[32]);
      }
      testcase( iTrunk==mxPage );
      if( iTrunk>mxPage || nSearch++ > n ){
        rc = SQLITE_CORRUPT_PGNO(pPrevTrunk ? pPrevTrunk->pgno : 1);
      }else{
        rc = btreeGetUnusedPage(pBt, iTrunk, &pTrunk, 0);
      }
      if( rc ){
        pTrunk = 0;
        goto end_allocate_page;
      }
      assert( pTrunk!=0 );
      assert( pTrunk->aData!=0 );
      /* EVIDENCE-OF: R-13523-04394 The second integer on a freelist trunk page
      ** is the number of leaf page pointers to follow. */
      k = get4byte(&pTrunk->aData[4]);
      if( k==0 && !searchList ){
        /* The trunk has no leaves and the list is not being searched. 
        ** So extract the trunk page itself and use it as the newly 
        ** allocated page */
        assert( pPrevTrunk==0 );
        rc = sqlite3PagerWrite(pTrunk->pDbPage);
        if( rc ){
          goto end_allocate_page;
        }
        *pPgno = iTrunk;
        memcpy(&pPage1->aData[32], &pTrunk->aData[0], 4);
        *ppPage = pTrunk;
        pTrunk = 0;
        TRACE(("ALLOCATE: %d trunk - %d free pages left\n", *pPgno, n-1));
      }else if( k>(u32)(pBt->usableSize/4 - 2) ){
        /* Value of k is out of range.  Database corruption */
        rc = SQLITE_CORRUPT_PGNO(iTrunk);
        goto end_allocate_page;
#ifndef SQLITE_OMIT_AUTOVACUUM
      }else if( searchList 
            && (nearby==iTrunk || (iTrunk<nearby && eMode==BTALLOC_LE)) 
      ){
        /* The list is being searched and this trunk page is the page
        ** to allocate, regardless of whether it has leaves.
        */
        *pPgno = iTrunk;
        *ppPage = pTrunk;
        searchList = 0;
        rc = sqlite3PagerWrite(pTrunk->pDbPage);
        if( rc ){
          goto end_allocate_page;
        }
        if( k==0 ){
          if( !pPrevTrunk ){
            memcpy(&pPage1->aData[32], &pTrunk->aData[0], 4);
          }else{
            rc = sqlite3PagerWrite(pPrevTrunk->pDbPage);
            if( rc!=SQLITE_OK ){
              goto end_allocate_page;
            }
            memcpy(&pPrevTrunk->aData[0], &pTrunk->aData[0], 4);
          }
        }else{
          /* The trunk page is required by the caller but it contains 
          ** pointers to free-list leaves. The first leaf becomes a trunk
          ** page in this case.
          */
          MemPage *pNewTrunk;
          Pgno iNewTrunk = get4byte(&pTrunk->aData[8]);
          if( iNewTrunk>mxPage ){ 
            rc = SQLITE_CORRUPT_PGNO(iTrunk);
            goto end_allocate_page;
          }
          testcase( iNewTrunk==mxPage );
          rc = btreeGetUnusedPage(pBt, iNewTrunk, &pNewTrunk, 0);
          if( rc!=SQLITE_OK ){
            goto end_allocate_page;
          }
          rc = sqlite3PagerWrite(pNewTrunk->pDbPage);
          if( rc!=SQLITE_OK ){
            releasePage(pNewTrunk);
            goto end_allocate_page;
          }
          memcpy(&pNewTrunk->aData[0], &pTrunk->aData[0], 4);
          put4byte(&pNewTrunk->aData[4], k-1);
          memcpy(&pNewTrunk->aData[8], &pTrunk->aData[12], (k-1)*4);
          releasePage(pNewTrunk);
          if( !pPrevTrunk ){
            assert( sqlite3PagerIswriteable(pPage1->pDbPage) );
            put4byte(&pPage1->aData[32], iNewTrunk);
          }else{
            rc = sqlite3PagerWrite(pPrevTrunk->pDbPage);
            if( rc ){
              goto end_allocate_page;
            }
            put4byte(&pPrevTrunk->aData[0], iNewTrunk);
          }
        }
        pTrunk = 0;
        TRACE(("ALLOCATE: %d trunk - %d free pages left\n", *pPgno, n-1));
#endif
      }else if( k>0 ){
        /* Extract a leaf from the trunk */
        u32 closest;
        Pgno iPage;
        unsigned char *aData = pTrunk->aData;
        if( nearby>0 ){
          u32 i;
          closest = 0;
          if( eMode==BTALLOC_LE ){
            for(i=0; i<k; i++){
              iPage = get4byte(&aData[8+i*4]);
              if( iPage<=nearby ){
                closest = i;
                break;
              }
            }
          }else{
            int dist;
            dist = sqlite3AbsInt32(get4byte(&aData[8]) - nearby);
            for(i=1; i<k; i++){
              int d2 = sqlite3AbsInt32(get4byte(&aData[8+i*4]) - nearby);
              if( d2<dist ){
                closest = i;
                dist = d2;
              }
            }
          }
        }else{
          closest = 0;
        }

        iPage = get4byte(&aData[8+closest*4]);
        testcase( iPage==mxPage );
        if( iPage>mxPage ){
          rc = SQLITE_CORRUPT_PGNO(iTrunk);
          goto end_allocate_page;
        }
        testcase( iPage==mxPage );
        if( !searchList 
         || (iPage==nearby || (iPage<nearby && eMode==BTALLOC_LE)) 
        ){
          int noContent;
          *pPgno = iPage;
          TRACE(("ALLOCATE: %d was leaf %d of %d on trunk %d"
                 ": %d more free pages\n",
                 *pPgno, closest+1, k, pTrunk->pgno, n-1));
          rc = sqlite3PagerWrite(pTrunk->pDbPage);
          if( rc ) goto end_allocate_page;
          if( closest<k-1 ){
            memcpy(&aData[8+closest*4], &aData[4+k*4], 4);
          }
          put4byte(&aData[4], k-1);
          noContent = !btreeGetHasContent(pBt, *pPgno)? PAGER_GET_NOCONTENT : 0;
          rc = btreeGetUnusedPage(pBt, *pPgno, ppPage, noContent);
          if( rc==SQLITE_OK ){
            rc = sqlite3PagerWrite((*ppPage)->pDbPage);
            if( rc!=SQLITE_OK ){
              releasePage(*ppPage);
              *ppPage = 0;
            }
          }
          searchList = 0;
        }
      }
      releasePage(pPrevTrunk);
      pPrevTrunk = 0;
    }while( searchList );
  }else{
    /* There are no pages on the freelist, so append a new page to the
    ** database image.
    **
    ** Normally, new pages allocated by this block can be requested from the
    ** pager layer with the 'no-content' flag set. This prevents the pager
    ** from trying to read the pages content from disk. However, if the
    ** current transaction has already run one or more incremental-vacuum
    ** steps, then the page we are about to allocate may contain content
    ** that is required in the event of a rollback. In this case, do
    ** not set the no-content flag. This causes the pager to load and journal
    ** the current page content before overwriting it.
    **
    ** Note that the pager will not actually attempt to load or journal 
    ** content for any page that really does lie past the end of the database
    ** file on disk. So the effects of disabling the no-content optimization
    ** here are confined to those pages that lie between the end of the
    ** database image and the end of the database file.
    */
    int bNoContent = (0==IfNotOmitAV(pBt->bDoTruncate))? PAGER_GET_NOCONTENT:0;

    rc = sqlite3PagerWrite(pBt->pPage1->pDbPage);
    if( rc ) return rc;
    pBt->nPage++;
    if( pBt->nPage==PENDING_BYTE_PAGE(pBt) ) pBt->nPage++;

#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum && PTRMAP_ISPAGE(pBt, pBt->nPage) ){
      /* If *pPgno refers to a pointer-map page, allocate two new pages
      ** at the end of the file instead of one. The first allocated page
      ** becomes a new pointer-map page, the second is used by the caller.
      */
      MemPage *pPg = 0;
      TRACE(("ALLOCATE: %d from end of file (pointer-map page)\n", pBt->nPage));
      assert( pBt->nPage!=PENDING_BYTE_PAGE(pBt) );
      rc = btreeGetUnusedPage(pBt, pBt->nPage, &pPg, bNoContent);
      if( rc==SQLITE_OK ){
        rc = sqlite3PagerWrite(pPg->pDbPage);
        releasePage(pPg);
      }
      if( rc ) return rc;
      pBt->nPage++;
      if( pBt->nPage==PENDING_BYTE_PAGE(pBt) ){ pBt->nPage++; }
    }
#endif
    put4byte(28 + (u8*)pBt->pPage1->aData, pBt->nPage);
    *pPgno = pBt->nPage;

    assert( *pPgno!=PENDING_BYTE_PAGE(pBt) );
    rc = btreeGetUnusedPage(pBt, *pPgno, ppPage, bNoContent);
    if( rc ) return rc;
    rc = sqlite3PagerWrite((*ppPage)->pDbPage);
    if( rc!=SQLITE_OK ){
      releasePage(*ppPage);
      *ppPage = 0;
    }
    TRACE(("ALLOCATE: %d from end of file\n", *pPgno));
  }

  assert( *pPgno!=PENDING_BYTE_PAGE(pBt) );

end_allocate_page:
  releasePage(pTrunk);
  releasePage(pPrevTrunk);
  assert( rc!=SQLITE_OK || sqlite3PagerPageRefcount((*ppPage)->pDbPage)<=1 );
  assert( rc!=SQLITE_OK || (*ppPage)->isInit==0 );
  return rc;
}